

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O3

void __thiscall nuraft::raft_server::become_leader(raft_server *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __int_type _Var3;
  __int_type _Var4;
  _Hash_node_base *p_Var5;
  peer *pp;
  element_type *peVar6;
  context *pcVar7;
  int iVar8;
  int iVar9;
  int32 iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  buffer *pbVar11;
  size_t sVar12;
  undefined4 extraout_var_03;
  long lVar13;
  undefined4 extraout_var_04;
  undefined8 this_00;
  ulong uVar14;
  undefined8 uVar15;
  Param param;
  ulong my_term;
  ptr<log_entry> entry;
  ptr<buffer> conf_buf;
  ptr<raft_params> params;
  undefined1 local_b8 [44];
  __int_type_conflict _Stack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  cluster_config *local_80;
  __atomic_base<unsigned_long> local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  ptr<log_entry> local_68;
  undefined1 local_58 [16];
  undefined8 local_48;
  _Alloc_hider local_40;
  _List_node_base *local_38;
  
  stop_election_timer(this);
  iVar8 = pthread_mutex_lock((pthread_mutex_t *)&this->commit_ret_elems_lock_);
  if (iVar8 != 0) {
    std::__throw_system_error(iVar8);
  }
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1 != (element_type *)0x0) && (iVar8 = (*peVar1->_vptr_logger[7])(), 3 < iVar8)) {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_
              ((string *)local_b8,"number of pending commit elements: %zu",
               (this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    (*peVar1->_vptr_logger[8])
              (peVar1,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
               ,"become_leader",0x3dd,local_b8);
    if ((buffer *)local_b8._0_8_ != (buffer *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->commit_ret_elems_lock_);
  context::get_params((context *)&stack0xffffffffffffffb8);
  iVar8 = pthread_mutex_lock((pthread_mutex_t *)&this->cli_lock_);
  if (iVar8 == 0) {
    LOCK();
    (this->role_)._M_i = leader;
    UNLOCK();
    LOCK();
    (this->leader_).super___atomic_base<int>._M_i = this->id_;
    UNLOCK();
    p_Var2 = (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    timer_helper::set_duration_us
              (&this->leadership_transfer_timer_,(long)*(int *)(local_48 + 0x44) * 1000);
    timer_helper::reset(&this->leadership_transfer_timer_);
    iVar8 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_log_store[2])();
    LOCK();
    (this->precommit_index_).super___atomic_base<unsigned_long>._M_i =
         CONCAT44(extraout_var,iVar8) - 1;
    UNLOCK();
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) && (iVar8 = (*peVar1->_vptr_logger[7])(), 3 < iVar8)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      _Var3 = (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i;
      _Var4 = (this->precommit_index_).super___atomic_base<unsigned_long>._M_i;
      iVar8 = (*((this->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_log_store[2])();
      msg_if_given_abi_cxx11_
                ((string *)local_b8,
                 "state machine commit index %lu, precommit index %lu, last log index %lu",_Var3,
                 _Var4,CONCAT44(extraout_var_00,iVar8) + -1);
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"become_leader",0x3ed,local_b8);
      if ((buffer *)local_b8._0_8_ != (buffer *)(local_b8 + 0x10)) {
        operator_delete((void *)local_b8._0_8_);
      }
    }
    for (p_Var5 = (this->peers_)._M_h._M_before_begin._M_nxt; p_Var5 != (_Hash_node_base *)0x0;
        p_Var5 = p_Var5->_M_nxt) {
      pp = (peer *)p_Var5[2]._M_nxt;
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var5[3]._M_nxt;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      clear_snapshot_sync_ctx(this,pp);
      iVar8 = (*((this->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_log_store[2])();
      LOCK();
      (pp->next_log_idx_).super___atomic_base<unsigned_long>._M_i = CONCAT44(extraout_var_01,iVar8);
      UNLOCK();
      enable_hb_for_peer(this,pp);
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
    }
    get_config((raft_server *)(local_b8 + 0x28));
    _Var3 = (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i;
    iVar8 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_log_store[2])();
    uVar14 = _Var3 + 1;
    this_00 = _local_88;
    uVar15 = stack0xffffffffffffff70;
    if (uVar14 < CONCAT44(extraout_var_02,iVar8)) {
      do {
        peVar6 = (this->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (*peVar6->_vptr_log_store[10])(&local_78,peVar6,uVar14);
        _local_88 = this_00;
        if (*(log_val_type *)(local_78._M_i + 8) == conf) {
          peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((peVar1 != (element_type *)0x0) &&
             (iVar9 = (*peVar1->_vptr_logger[7])(peVar1), 3 < iVar9)) {
            peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            pbVar11 = log_entry::get_buf((log_entry *)local_78._M_i);
            sVar12 = buffer::size(pbVar11);
            msg_if_given_abi_cxx11_
                      ((string *)local_b8,"found uncommitted config at %lu, size %zu",uVar14,sVar12)
            ;
            (*peVar1->_vptr_logger[8])
                      (peVar1,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                       ,"become_leader",0x405,local_b8);
            if ((buffer *)local_b8._0_8_ != (buffer *)(local_b8 + 0x10)) {
              operator_delete((void *)local_b8._0_8_);
            }
          }
          pbVar11 = log_entry::get_buf((log_entry *)local_78._M_i);
          cluster_config::deserialize((cluster_config *)local_b8,pbVar11);
          _local_88 = local_b8._8_8_;
          uVar15 = local_b8._0_8_;
          local_b8._0_8_ = (buffer *)0x0;
          local_b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
          }
        }
        if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
        }
        uVar14 = uVar14 + 1;
        this_00 = _local_88;
      } while (CONCAT44(extraout_var_02,iVar8) != uVar14);
    }
    unique0x10000f43 = uVar15;
    cluster_config::serialize((cluster_config *)local_b8);
    cluster_config::deserialize((cluster_config *)&local_78,(buffer *)local_b8._0_8_);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
    }
    iVar8 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_log_store[2])();
    *(undefined8 *)(local_78._M_i + 8) = *(undefined8 *)local_78._M_i;
    *(ulong *)local_78._M_i = CONCAT44(extraout_var_03,iVar8);
    cluster_config::serialize((cluster_config *)local_58);
    local_b8._0_8_ =
         (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
         ->term_).super___atomic_base<unsigned_long>._M_i;
    local_b8[0x26] = 2;
    lVar13 = std::chrono::_V2::system_clock::now();
    local_38 = (_List_node_base *)(lVar13 / 1000);
    local_68.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,unsigned_long,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type,unsigned_long>
              (&local_68.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(log_entry **)&local_68,
               (allocator<nuraft::log_entry> *)(local_b8 + 0x27),(unsigned_long *)local_b8,
               (shared_ptr<nuraft::buffer> *)local_58,local_b8 + 0x26,
               (unsigned_long *)&stack0xffffffffffffffc8);
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) && (iVar8 = (*peVar1->_vptr_logger[7])(), 3 < iVar8)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar8 = (*((this->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_log_store[2])();
      msg_if_given_abi_cxx11_
                ((string *)local_b8,"[BECOME LEADER] appended new config at %lu",
                 CONCAT44(extraout_var_04,iVar8));
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"become_leader",0x414,local_b8);
      if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
        operator_delete((void *)local_b8._0_8_);
      }
    }
    store_log_entry(this,&local_68,0);
    this->config_changing_ = true;
    if (local_68.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    }
    if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_local_88 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_local_88);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->cli_lock_);
    _Stack_8c = (this->leader_).super___atomic_base<int>._M_i;
    local_b8._40_4_ = this->id_;
    local_88 = 0xffffffff;
    local_78._M_i =
         (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
         ->term_).super___atomic_base<unsigned_long>._M_i;
    pcVar7 = (this->ctx_)._M_t.
             super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
             super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
             super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl;
    local_80 = (cluster_config *)&local_78;
    if ((pcVar7->cb_func_).func.super__Function_base._M_manager != (_Manager_type)0x0) {
      local_58._0_4_ = BecomeLeader;
      local_b8._0_8_ = local_b8 + 0x28;
      (*(pcVar7->cb_func_).func._M_invoker)
                ((_Any_data *)&pcVar7->cb_func_,(Type *)local_58,(Param **)local_b8);
    }
    LOCK();
    (this->write_paused_)._M_base._M_i = false;
    UNLOCK();
    LOCK();
    (this->next_leader_candidate_).super___atomic_base<int>._M_i = -1;
    UNLOCK();
    LOCK();
    (this->initialized_)._M_base._M_i = true;
    UNLOCK();
    LOCK();
    (this->pre_vote_).quorum_reject_count_.super___atomic_base<int>._M_i = 0;
    UNLOCK();
    LOCK();
    (this->pre_vote_).failure_count_.super___atomic_base<int>._M_i = 0;
    UNLOCK();
    LOCK();
    (this->data_fresh_)._M_base._M_i = true;
    UNLOCK();
    request_append_entries(this);
    if ((this->my_priority_ == 0) && (iVar10 = get_num_voting_members(this), 1 < iVar10)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar1 != (element_type *)0x0) && (iVar8 = (*peVar1->_vptr_logger[7])(), 3 < iVar8)) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_b8,"[BECOME LEADER] my priority is 0, will resign shortly");
        (*peVar1->_vptr_logger[8])
                  (peVar1,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"become_leader",0x42b,local_b8);
        if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
          operator_delete((void *)local_b8._0_8_);
        }
      }
      yield_leadership(this,false,-1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_p);
    }
    return;
  }
  std::__throw_system_error(iVar8);
}

Assistant:

void raft_server::become_leader() {
    stop_election_timer();

    {   auto_lock(commit_ret_elems_lock_);
        p_in("number of pending commit elements: %zu",
             commit_ret_elems_.size());
    }

    ptr<raft_params> params = ctx_->get_params();
    {   auto_lock(cli_lock_);
        role_ = srv_role::leader;
        leader_ = id_;
        srv_to_join_.reset();
        leadership_transfer_timer_.set_duration_ms
            (params->leadership_transfer_min_wait_time_);
        leadership_transfer_timer_.reset();
        precommit_index_ = log_store_->next_slot() - 1;
        p_in("state machine commit index %" PRIu64 ", "
             "precommit index %" PRIu64 ", last log index %" PRIu64,
             sm_commit_index_.load(),
             precommit_index_.load(),
             log_store_->next_slot() - 1);
        ptr<snapshot> nil_snp;
        for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
            ptr<peer> pp = it->second;
            clear_snapshot_sync_ctx(*pp);
            // Reset RPC client for all peers.
            // NOTE: Now we don't reset client, as we already did it
            //       during pre-vote phase.
            // reconnect_client(*pp);

            pp->set_next_log_idx(log_store_->next_slot());
            enable_hb_for_peer(*pp);
        }

        // If there are uncommitted logs, search if conf log exists.
        ptr<cluster_config> last_config = get_config();

        ulong s_idx = sm_commit_index_ + 1;
        ulong e_idx = log_store_->next_slot();
        for (ulong ii = s_idx; ii < e_idx; ++ii) {
            ptr<log_entry> le = log_store_->entry_at(ii);
            if (le->get_val_type() != log_val_type::conf) continue;

            p_in("found uncommitted config at %" PRIu64 ", size %zu",
                 ii, le->get_buf().size());
            last_config = cluster_config::deserialize(le->get_buf());
        }

        // WARNING: WE SHOULD NOT CHANGE THE ORIGINAL CONTENTS DIRECTLY!
        ptr<cluster_config> last_config_cloned =
            cluster_config::deserialize( *last_config->serialize() );
        last_config_cloned->set_log_idx(log_store_->next_slot());
        ptr<buffer> conf_buf = last_config_cloned->serialize();
        ptr<log_entry> entry
            ( cs_new<log_entry>
              ( state_->get_term(),
                conf_buf,
                log_val_type::conf,
                timer_helper::get_timeofday_us() ) );
        p_in("[BECOME LEADER] appended new config at %" PRIu64, log_store_->next_slot());
        store_log_entry(entry);
        config_changing_ = true;
    }

    cb_func::Param param(id_, leader_);
    ulong my_term = state_->get_term();
    param.ctx = &my_term;
    CbReturnCode rc = ctx_->cb_func_.call(cb_func::BecomeLeader, &param);
    (void)rc; // nothing to do in this callback.

    write_paused_ = false;
    next_leader_candidate_ = -1;
    initialized_ = true;
    pre_vote_.quorum_reject_count_ = 0;
    pre_vote_.failure_count_ = 0;
    data_fresh_ = true;

    request_append_entries();

    if (my_priority_ == 0 && get_num_voting_members() > 1) {
        // If this member's priority is zero, this node owns a temporary
        // leadership. Let other node takeover shortly.
        p_in("[BECOME LEADER] my priority is 0, will resign shortly");
        yield_leadership();
    }
}